

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

outer_range_iterator * __thiscall
burst::
semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>
::skip_while_less(outer_range_iterator *__return_storage_ptr__,
                 semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>
                 *this,outer_range_iterator *range,outer_range_iterator *candidate)

{
  type_conflict4 tVar1;
  bool bVar2;
  iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
  *piVar3;
  reference piVar4;
  reference piVar5;
  reference piVar6;
  outer_range_iterator *candidate_local;
  outer_range_iterator *range_local;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>
  *this_local;
  
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long>
                             *)range,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long>
                                      *)candidate), tVar1) {
    piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
              *)boost::iterators::detail::
                iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                              *)range);
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
             ::front(piVar3);
    piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
              *)boost::iterators::detail::
                iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                              *)candidate);
    piVar5 = boost::iterator_range_detail::
             iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
             ::front(piVar3);
    bVar2 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
            operator()(&this->field_0x38,piVar4,piVar5);
    if (bVar2) {
      piVar6 = boost::iterators::detail::
               iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
               ::operator*((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                            *)range);
      piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                                *)candidate);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      skip_to_lower_bound<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,int,std::less<void>>
                (piVar6,piVar4);
      piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                                *)range);
      bVar2 = boost::iterator_range_detail::
              iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
              ::empty(piVar3);
      if (bVar2) break;
      piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                                *)candidate);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      piVar3 = (iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                                *)range);
      piVar5 = boost::iterator_range_detail::
               iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      bVar2 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
              operator()(&this->field_0x38,piVar4,piVar5);
      if (bVar2) break;
    }
    boost::iterators::detail::
    iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_long,_false,_false>
                  *)range);
  }
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(__return_storage_ptr__,range);
  return __return_storage_ptr__;
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }